

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::NodeTranslator::compileAnnotationApplications
          (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *__return_storage_ptr__,
          NodeTranslator *this,Reader annotations,StringPtr targetsFlagName)

{
  ErrorReporter *pEVar1;
  BrandScope *pBVar2;
  BrandedDecl *pBVar3;
  Resolver *pRVar4;
  Builder target;
  Reader source;
  Reader type;
  Reader source_00;
  Reader type_00;
  Builder target_00;
  Builder target_01;
  Reader type_01;
  ImplicitParams implicitMethodParams;
  undefined1 auVar5 [40];
  Builder target_02;
  Reader name_00;
  Reader name_01;
  Reader name_02;
  Reader name_03;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 typeScope;
  undefined8 uVar6;
  undefined8 uVar7;
  word *pwVar8;
  ReaderFor<bool> RVar9;
  undefined8 uVar10;
  ulong uVar11;
  SegmentBuilder *pSVar12;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *pOVar13;
  long lVar14;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *pOVar15;
  NodeTranslator *pNVar16;
  char (*in_R8) [49];
  long lVar17;
  ElementCount index;
  ElementCount index_00;
  ulong uVar18;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  ArrayDisposer *in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  undefined8 uVar19;
  undefined8 uStack_4c0;
  Builder scope;
  undefined1 uStack_489;
  int local_488;
  undefined4 uStack_484;
  Vector<capnp::compiler::NodeTranslator::BrandScope_*> levels;
  NullableValue<capnp::Schema> annotationSchema;
  Reader name;
  Builder bindings;
  Reader node;
  undefined1 local_358 [40];
  Builder annotationBuilder;
  Builder scopes;
  undefined8 uStack_2e0;
  Reader value;
  Reader local_220;
  Reader annotation;
  undefined1 local_1c0 [48];
  BrandScope *pBStack_190;
  word local_188;
  SegmentBuilder *pSStack_180;
  CapTableBuilder *local_178;
  word *pwStack_170;
  Reader local_168 [2];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> decl;
  BuilderFor<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> builder;
  
  if ((annotations.reader.elementCount == 0) || (this->compileAnnotations == false)) {
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
    (__return_storage_ptr__->builder).tag.content = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  }
  else {
    Orphanage::newOrphan<capnp::List<capnp::schema::Annotation,(capnp::Kind)3>>
              (__return_storage_ptr__,&this->orphanage,annotations.reader.elementCount);
    capnp::_::OrphanGetImpl<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::apply(&builder,&__return_storage_ptr__->builder);
    index = 0;
    pOVar13 = __return_storage_ptr__;
    while( true ) {
      if (annotations.reader.elementCount <= index) break;
      capnp::_::ListReader::getStructElement(&annotation._reader,&annotations.reader,index);
      capnp::_::ListBuilder::getStructElement(&annotationBuilder._builder,&builder.builder,index);
      capnp::schema::Annotation::Builder::initValue
                ((Builder *)&decl,(Builder *)&annotationBuilder._builder);
      *(undefined2 *)decl.field_1._8_8_ = 0;
      Declaration::AnnotationApplication::Reader::getName(&name,(Reader *)&annotation._reader);
      scope._builder.dataSize = 0;
      scope._builder.pointerCount = 0;
      scope._builder._38_2_ = 0;
      scope._builder.data = (void *)0x0;
      scope._builder.pointers._0_6_ = 0;
      scope._builder.pointers._6_2_ = 0;
      scope._builder.segment._0_1_ = '\0';
      scope._builder.segment._1_7_ = 0;
      scope._builder.capTable = (CapTableBuilder *)0x0;
      local_488 = 0x7fffffff;
      implicitMethodParams.params.reader._39_1_ = uStack_489;
      implicitMethodParams.params.reader.structDataSize = 0;
      implicitMethodParams.params.reader.structPointerCount = 0;
      implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
      source._reader.capTable._0_4_ = (int)name._reader.capTable;
      source._reader.segment = name._reader.segment;
      source._reader.capTable._4_4_ = (int)((ulong)name._reader.capTable >> 0x20);
      source._reader.data._0_4_ = (int)name._reader.data;
      source._reader.data._4_4_ = (int)((ulong)name._reader.data >> 0x20);
      source._reader.pointers._0_4_ = (int)name._reader.pointers;
      source._reader.pointers._4_4_ = (int)((ulong)name._reader.pointers >> 0x20);
      source._reader.dataSize = name._reader.dataSize;
      source._reader._36_4_ = name._reader._36_4_;
      source._reader.nestingLimit = name._reader.nestingLimit;
      source._reader._44_4_ = name._reader._44_4_;
      auVar5 = ZEXT2440(ZEXT824(0));
      implicitMethodParams.scopeId = auVar5._0_8_;
      implicitMethodParams.params.reader.segment = (SegmentReader *)auVar5._8_8_;
      implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar5._16_8_;
      implicitMethodParams.params.reader.ptr = (byte *)auVar5._24_8_;
      implicitMethodParams.params.reader.elementCount = auVar5._32_4_;
      implicitMethodParams.params.reader.step = auVar5._36_4_;
      implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
      implicitMethodParams.params.reader._44_4_ = uStack_484;
      BrandScope::compileDeclExpression
                ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&scopes,
                 (this->localBrand).ptr,source,this->resolver,implicitMethodParams);
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                (&decl,(NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&scopes);
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
                ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&scopes);
      uVar19 = decl.field_1.value.brand.ptr;
      if (decl.isSet == true) {
        if (decl.field_1.value.body.tag == 2) {
          pOVar15 = (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)0xb;
          if ((short)pOVar13 != 0xb) {
            pEVar1 = this->errorReporter;
            name_00._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb38;
            name_00._reader.segment = (SegmentReader *)in_stack_fffffffffffffb30;
            name_00._reader.data = (void *)uStack_4c0;
            name_00._reader.pointers._0_1_ = (char)scope._builder.segment;
            name_00._reader.pointers._1_7_ = scope._builder.segment._1_7_;
            name_00._reader._32_8_ = scope._builder.capTable;
            name_00._reader._40_8_ = scope._builder.data;
            expressionString(name_00);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      ((String *)&scopes,(kj *)0x29cfdb,(char (*) [2])&scope,
                       (String *)"\' is not an annotation.",(char (*) [24])in_R8);
            pSVar12 = (SegmentBuilder *)0x2b02ed;
            if (scopes.builder.capTable != (CapTableBuilder *)0x0) {
              pSVar12 = scopes.builder.segment;
            }
            message.content.size_ =
                 (long)&((scopes.builder.capTable)->super_CapTableReader)._vptr_CapTableReader +
                 (ulong)(scopes.builder.capTable == (CapTableBuilder *)0x0);
            message.content.ptr = (char *)pSVar12;
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(pEVar1,&name,message);
            kj::Array<char>::~Array((Array<char> *)&scopes);
            kj::Array<char>::~Array((Array<char> *)&scope);
            goto LAB_00219031;
          }
        }
        else {
          pOVar15 = (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)
                    (ulong)(ushort)decl.field_1._32_2_;
          if (decl.field_1._32_2_ == 0xb) {
            if (decl.field_1.value.body.tag != 1) {
              kj::_::Debug::Fault::Fault
                        ((Fault *)&scopes,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                         ,0x38f,FAILED,"body.is<Resolver::ResolvedDecl>()","");
              kj::_::Debug::Fault::fatal((Fault *)&scopes);
            }
            levels.builder.ptr = (BrandScope **)0x0;
            levels.builder.pos = (RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *)0x0;
            levels.builder.endPtr = (BrandScope **)0x0;
            uVar10 = decl.field_1.value.brand.ptr;
            do {
              annotationSchema._0_8_ = uVar10;
              if (((((BrandScope *)uVar10)->params).size_ != 0) ||
                 ((((BrandScope *)uVar10)->inherited == true &&
                  (((BrandScope *)uVar10)->leafParamCount != 0)))) {
                kj::Vector<capnp::compiler::NodeTranslator::BrandScope*>::
                add<capnp::compiler::NodeTranslator::BrandScope*&>
                          ((Vector<capnp::compiler::NodeTranslator::BrandScope*> *)&levels,
                           (BrandScope **)&annotationSchema);
              }
              uVar10 = *(long *)(annotationSchema._0_8_ + 0x20);
            } while ((BrandScope *)uVar10 != (BrandScope *)0x0);
            if (levels.builder.pos != levels.builder.ptr) {
              capnp::schema::Annotation::Builder::initBrand((Builder *)&scope,&annotationBuilder);
              capnp::schema::Brand::Builder::initScopes
                        (&scopes,(Builder *)&scope,
                         (uint)((ulong)((long)levels.builder.pos - (long)levels.builder.ptr) >> 3));
              lVar14 = (long)levels.builder.pos - (long)levels.builder.ptr;
              for (uVar18 = 0; uVar18 != lVar14 >> 3; uVar18 = uVar18 + 1) {
                capnp::_::ListBuilder::getStructElement
                          (&scope._builder,&scopes.builder,(ElementCount)uVar18);
                pBVar2 = levels.builder.ptr[uVar18 & 0xffffffff];
                *(uint64_t *)scope._builder.data = pBVar2->leafId;
                if (pBVar2->inherited == true) {
                  *(undefined2 *)((long)scope._builder.data + 8) = 1;
                }
                else {
                  capnp::schema::Brand::Scope::Builder::initBind
                            (&bindings,&scope,(uint)(pBVar2->params).size_);
                  uVar11 = bindings.builder._24_8_ & 0xffffffff;
                  index_00 = 0;
                  for (lVar17 = 0; uVar11 * 0xa8 - lVar17 != 0; lVar17 = lVar17 + 0xa8) {
                    pBVar3 = (levels.builder.ptr[uVar18 & 0xffffffff]->params).ptr;
                    pEVar1 = ((BrandScope *)uVar19)->errorReporter;
                    capnp::_::ListBuilder::getStructElement
                              ((StructBuilder *)&value,&bindings.builder,index_00);
                    capnp::schema::Brand::Binding::Builder::initType
                              ((Builder *)&node,(Builder *)&value);
                    target._builder.capTable._0_4_ = (int)node._reader.capTable;
                    target._builder.segment = (SegmentBuilder *)node._reader.segment;
                    target._builder.capTable._4_4_ = (int)((ulong)node._reader.capTable >> 0x20);
                    target._builder.data._0_4_ = (int)node._reader.data;
                    target._builder.data._4_4_ = (int)((ulong)node._reader.data >> 0x20);
                    target._builder.pointers._0_4_ = (int)node._reader.pointers;
                    target._builder.pointers._4_4_ = (int)((ulong)node._reader.pointers >> 0x20);
                    target._builder.dataSize = node._reader.dataSize;
                    target._builder._36_4_ = node._reader._36_4_;
                    BrandedDecl::compileAsType
                              ((BrandedDecl *)((long)&(pBVar3->body).tag + lVar17),pEVar1,target);
                    index_00 = index_00 + 1;
                  }
                }
              }
            }
            kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*>::dispose
                      (&levels.builder);
            uVar19 = decl.field_1._8_8_;
            *(undefined8 *)annotationBuilder._builder.data = decl.field_1._8_8_;
            pRVar4 = this->resolver;
            capnp::schema::Annotation::Builder::getBrand((Builder *)&scopes,&annotationBuilder);
            capnp::_::StructBuilder::asReader((StructBuilder *)&scopes);
            (*pRVar4->_vptr_Resolver[6])(&scope,pRVar4,uVar19);
            annotationSchema.isSet = (bool)(char)scope._builder.segment;
            if ((bool)(char)scope._builder.segment == true) {
              annotationSchema.field_1 =
                   (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                   scope._builder.capTable;
              Schema::getProto((Reader *)&scopes,&annotationSchema.field_1.value);
              node._reader.dataSize = scopes.builder.structDataSize;
              node._reader.pointerCount = scopes.builder.structPointerCount;
              node._reader._38_1_ = scopes.builder.elementSize;
              node._reader._39_1_ = scopes.builder._39_1_;
              node._reader._40_8_ = uStack_2e0;
              node._reader.data = scopes.builder.ptr;
              node._reader.pointers = (WirePointer *)scopes.builder._24_8_;
              node._reader.segment = &(scopes.builder.segment)->super_SegmentReader;
              node._reader.capTable = &(scopes.builder.capTable)->super_CapTableReader;
              uStack_489 = scopes.builder._39_1_;
              _local_488 = uStack_2e0;
              scope._builder.pointers._0_6_ = SUB86(scopes.builder.ptr,0);
              scope._builder.pointers._6_2_ = (undefined2)((ulong)scopes.builder.ptr >> 0x30);
              scope._builder.dataSize = scopes.builder.elementCount;
              scope._builder.pointerCount = (StructPointerCount)scopes.builder.step;
              scope._builder._38_2_ = scopes.builder.step._2_2_;
              scope._builder.capTable = (CapTableBuilder *)scopes.builder.segment;
              scope._builder.data = scopes.builder.capTable;
              scope._builder.segment._0_1_ = -0x78;
              scope._builder.segment._1_7_ = 0x30b4;
              DynamicStruct::Reader::get((Reader *)&scopes,(Reader *)&scope,targetsFlagName);
              RVar9 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&scopes);
              DynamicValue::Reader::~Reader((Reader *)&scopes);
              if (!RVar9) {
                pEVar1 = this->errorReporter;
                name_02._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb38;
                name_02._reader.segment = (SegmentReader *)in_stack_fffffffffffffb30;
                name_02._reader.data = (void *)uStack_4c0;
                name_02._reader.pointers._0_1_ = (char)scope._builder.segment;
                name_02._reader.pointers._1_7_ = scope._builder.segment._1_7_;
                name_02._reader._32_8_ = scope._builder.capTable;
                name_02._reader._40_8_ = scope._builder.data;
                expressionString(name_02);
                kj::str<char_const(&)[2],kj::String,char_const(&)[49]>
                          ((String *)&scopes,(kj *)0x29cfdb,(char (*) [2])&scope,
                           (String *)"\' cannot be applied to this kind of declaration.",in_R8);
                pSVar12 = (SegmentBuilder *)0x2b02ed;
                if (scopes.builder.capTable != (CapTableBuilder *)0x0) {
                  pSVar12 = scopes.builder.segment;
                }
                message_01.content.size_ =
                     (long)&((scopes.builder.capTable)->super_CapTableReader)._vptr_CapTableReader +
                     (ulong)(scopes.builder.capTable == (CapTableBuilder *)0x0);
                message_01.content.ptr = (char *)pSVar12;
                ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                          (pEVar1,&name,message_01);
                kj::Array<char>::~Array((Array<char> *)&scopes);
                kj::Array<char>::~Array((Array<char> *)&scope);
              }
              value._reader.dataSize = annotation._reader.dataSize;
              value._reader.pointerCount = annotation._reader.pointerCount;
              value._reader._38_2_ = annotation._reader._38_2_;
              uVar19 = value._reader._32_8_;
              value._reader.nestingLimit = annotation._reader.nestingLimit;
              value._reader._44_4_ = annotation._reader._44_4_;
              value._reader.data = annotation._reader.data;
              value._reader.pointers = annotation._reader.pointers;
              value._reader.segment = annotation._reader.segment;
              value._reader.capTable = annotation._reader.capTable;
              value._reader.dataSize = annotation._reader.dataSize;
              value._reader._32_8_ = uVar19;
              if ((value._reader.dataSize < 0x10) || (*annotation._reader.data == 0)) {
                capnp::schema::Node::Annotation::Reader::getType((Reader *)&scopes,&node);
                if ((scopes.builder.structDataSize < 0x10) || (*(short *)scopes.builder.ptr == 0)) {
                  capnp::schema::Annotation::Builder::getValue
                            ((Builder *)&scopes,&annotationBuilder);
                  scopes.builder.ptr[0] = '\0';
                  scopes.builder.ptr[1] = '\0';
                }
                else {
                  pEVar1 = this->errorReporter;
                  name_03._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb38;
                  name_03._reader.segment = (SegmentReader *)in_stack_fffffffffffffb30;
                  name_03._reader.data = (void *)uStack_4c0;
                  name_03._reader.pointers._0_1_ = (char)scope._builder.segment;
                  name_03._reader.pointers._1_7_ = scope._builder.segment._1_7_;
                  name_03._reader._32_8_ = scope._builder.capTable;
                  name_03._reader._40_8_ = scope._builder.data;
                  expressionString(name_03);
                  kj::str<char_const(&)[2],kj::String,char_const(&)[20]>
                            ((String *)&scopes,(kj *)0x29cfdb,(char (*) [2])&scope,
                             (String *)"\' requires a value.",(char (*) [20])in_R8);
                  pSVar12 = (SegmentBuilder *)0x2b02ed;
                  if (scopes.builder.capTable != (CapTableBuilder *)0x0) {
                    pSVar12 = scopes.builder.segment;
                  }
                  message_02.content.size_ =
                       (long)&((scopes.builder.capTable)->super_CapTableReader)._vptr_CapTableReader
                       + (ulong)(scopes.builder.capTable == (CapTableBuilder *)0x0);
                  message_02.content.ptr = (char *)pSVar12;
                  ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                            (pEVar1,&name,message_02);
                  kj::Array<char>::~Array((Array<char> *)&scopes);
                  kj::Array<char>::~Array((Array<char> *)&scope);
                  capnp::schema::Node::Annotation::Reader::getType(local_168,&node);
                  pNVar16 = (NodeTranslator *)local_1c0;
                  capnp::schema::Annotation::Builder::getValue
                            ((Builder *)pNVar16,&annotationBuilder);
                  type_00._reader.capTable._0_4_ = (int)local_168[0]._reader.capTable;
                  type_00._reader.segment = local_168[0]._reader.segment;
                  type_00._reader.capTable._4_4_ =
                       (int)((ulong)local_168[0]._reader.capTable >> 0x20);
                  type_00._reader.data._0_4_ = (int)local_168[0]._reader.data;
                  type_00._reader.data._4_4_ = (int)((ulong)local_168[0]._reader.data >> 0x20);
                  type_00._reader.pointers._0_4_ = (int)local_168[0]._reader.pointers;
                  type_00._reader.pointers._4_4_ =
                       (int)((ulong)local_168[0]._reader.pointers >> 0x20);
                  type_00._reader.dataSize = (StructDataBitCount)local_168[0]._reader._32_8_;
                  type_00._reader._36_4_ = SUB84(local_168[0]._reader._32_8_,4);
                  type_00._reader.nestingLimit = (int)local_168[0]._reader._40_8_;
                  type_00._reader._44_4_ = SUB84(local_168[0]._reader._40_8_,4);
                  target_01._builder.capTable = (CapTableBuilder *)local_1c0._8_8_;
                  target_01._builder.segment = (SegmentBuilder *)local_1c0._0_8_;
                  target_01._builder.data = (void *)local_1c0._16_8_;
                  target_01._builder.pointers = (WirePointer *)local_1c0._24_8_;
                  target_01._builder.dataSize = local_1c0._32_4_;
                  target_01._builder.pointerCount = local_1c0._36_2_;
                  target_01._builder._38_2_ = local_1c0._38_2_;
                  compileDefaultDefaultValue(pNVar16,type_00,target_01);
                }
              }
              else if (*annotation._reader.data == 1) {
                Declaration::AnnotationApplication::Value::Reader::getExpression
                          ((Reader *)(local_1c0 + 0x28),&value);
                capnp::schema::Node::Annotation::Reader::getType(&local_220,&node);
                pNVar16 = (NodeTranslator *)local_358;
                capnp::schema::Annotation::Builder::getValue((Builder *)pNVar16,&annotationBuilder);
                pwVar8 = pwStack_170;
                uVar6 = local_220._reader._40_8_;
                uVar19 = local_358._32_8_;
                typeScope = annotationSchema.field_1;
                levels.builder.endPtr = (BrandScope **)local_358._16_8_;
                levels.builder.disposer = (ArrayDisposer *)local_358._24_8_;
                levels.builder.ptr = (BrandScope **)local_358._0_8_;
                levels.builder.pos =
                     (RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *)local_358._8_8_;
                scope._builder.segment._0_1_ = (char)local_220._reader.segment;
                scope._builder.segment._1_7_ = (undefined7)((ulong)local_220._reader.segment >> 8);
                scope._builder.capTable = (CapTableBuilder *)local_220._reader.capTable;
                scope._builder.data = local_220._reader.data;
                scope._builder.pointers._0_6_ = SUB86(local_220._reader.pointers,0);
                scope._builder.pointers._6_2_ =
                     (undefined2)((ulong)local_220._reader.pointers >> 0x30);
                scope._builder.dataSize = local_220._reader.dataSize;
                scope._builder.pointerCount = local_220._reader.pointerCount;
                scope._builder._38_2_ = local_220._reader._38_2_;
                uStack_489 = local_220._reader._47_1_;
                bindings.builder.segment = (SegmentBuilder *)local_1c0._40_8_;
                bindings.builder.capTable = (CapTableBuilder *)pBStack_190;
                bindings.builder.ptr = (byte *)local_188.content;
                bindings.builder._24_8_ = pSStack_180;
                bindings.builder._32_8_ = local_178;
                type._reader.capTable._0_4_ = (int)local_220._reader.capTable;
                type._reader.segment = local_220._reader.segment;
                type._reader.capTable._4_4_ = (int)((ulong)local_220._reader.capTable >> 0x20);
                type._reader.data._0_4_ = (int)local_220._reader.data;
                type._reader.data._4_4_ = (int)((ulong)local_220._reader.data >> 0x20);
                type._reader.pointers._0_4_ = (int)local_220._reader.pointers;
                type._reader.pointers._4_4_ = (int)((ulong)local_220._reader.pointers >> 0x20);
                type._reader.dataSize = scope._builder.dataSize;
                type._reader._36_4_ = local_220._reader._36_4_;
                type._reader.nestingLimit = local_220._reader.nestingLimit;
                type._reader._44_4_ = local_220._reader._44_4_;
                target_00._builder.capTable = (CapTableBuilder *)local_358._8_8_;
                target_00._builder.segment = (SegmentBuilder *)local_358._0_8_;
                target_00._builder.data = (void *)local_358._16_8_;
                target_00._builder.pointers = (WirePointer *)local_358._24_8_;
                target_00._builder.dataSize = local_358._32_4_;
                target_00._builder.pointerCount = local_358._36_2_;
                target_00._builder._38_2_ = local_358._38_2_;
                compileDefaultDefaultValue(pNVar16,type,target_00);
                uVar7 = local_220._reader._40_8_;
                uVar10 = local_358._32_8_;
                if (((scope._builder.dataSize < 0x10) || (0x12 < *scope._builder.data)) ||
                   ((0x74000U >> (*scope._builder.data & 0x1f) & 1) == 0)) {
                  type_01._reader.segment._1_7_ = scope._builder.segment._1_7_;
                  type_01._reader.segment._0_1_ = (char)scope._builder.segment;
                  type_01._reader.pointers._6_2_ = scope._builder.pointers._6_2_;
                  type_01._reader.pointers._0_6_ = scope._builder.pointers._0_6_;
                  type_01._reader.pointerCount = scope._builder.pointerCount;
                  type_01._reader.dataSize = scope._builder.dataSize;
                  type_01._reader._38_2_ = scope._builder._38_2_;
                  source_00._reader.capTable._0_4_ = (int)bindings.builder.capTable;
                  source_00._reader.segment = &(bindings.builder.segment)->super_SegmentReader;
                  source_00._reader.capTable._4_4_ = (int)((ulong)bindings.builder.capTable >> 0x20)
                  ;
                  source_00._reader.data._0_4_ = (int)bindings.builder.ptr;
                  source_00._reader.data._4_4_ = (int)((ulong)bindings.builder.ptr >> 0x20);
                  source_00._reader.pointers._0_4_ = bindings.builder.elementCount;
                  source_00._reader.pointers._4_4_ = bindings.builder.step;
                  source_00._reader.dataSize = bindings.builder.structDataSize;
                  source_00._reader._36_4_ = bindings.builder._36_4_;
                  source_00._reader.nestingLimit = (int)pwVar8;
                  source_00._reader._44_4_ = (int)((ulong)pwVar8 >> 0x20);
                  type_01._reader.capTable = &(scope._builder.capTable)->super_CapTableReader;
                  type_01._reader.data = scope._builder.data;
                  local_220._reader.nestingLimit = (int)uVar6;
                  local_220._reader._44_4_ = SUB84(uVar6,4);
                  type_01._reader.nestingLimit = local_220._reader.nestingLimit;
                  type_01._reader._44_4_ = local_220._reader._44_4_;
                  target_02._builder.capTable = (CapTableBuilder *)levels.builder.pos;
                  target_02._builder.segment = (SegmentBuilder *)levels.builder.ptr;
                  target_02._builder.data = levels.builder.endPtr;
                  target_02._builder.pointers = (WirePointer *)levels.builder.disposer;
                  local_358._32_4_ = (undefined4)uVar19;
                  local_358._36_2_ = SUB82(uVar19,4);
                  local_358._38_2_ = SUB82(uVar19,6);
                  target_02._builder.dataSize = local_358._32_4_;
                  target_02._builder.pointerCount = local_358._36_2_;
                  target_02._builder._38_2_ = local_358._38_2_;
                  in_stack_fffffffffffffb30 = levels.builder.disposer;
                  local_358._32_8_ = uVar10;
                  local_220._reader._40_8_ = uVar7;
                  compileValue(this,source_00,type_01,typeScope.value.raw,target_02,true);
                  in_stack_fffffffffffffb38 = uVar19;
                }
                else {
                  scopes.builder.structDataSize = bindings.builder.structDataSize;
                  scopes.builder.structPointerCount = bindings.builder.structPointerCount;
                  scopes.builder.elementSize = bindings.builder.elementSize;
                  scopes.builder._39_1_ = bindings.builder._39_1_;
                  uStack_2e0 = pwVar8;
                  scopes.builder.ptr = bindings.builder.ptr;
                  scopes.builder.elementCount = bindings.builder.elementCount;
                  scopes.builder.step = bindings.builder.step;
                  scopes.builder.segment = bindings.builder.segment;
                  scopes.builder.capTable = bindings.builder.capTable;
                  kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::
                  add<capnp::compiler::NodeTranslator::UnfinishedValue>
                            (&this->unfinishedValues,(UnfinishedValue *)&scopes);
                }
              }
            }
            pOVar15 = (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)0xb;
          }
          else {
            pEVar1 = this->errorReporter;
            name_01._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb38;
            name_01._reader.segment = (SegmentReader *)in_stack_fffffffffffffb30;
            name_01._reader.data = (void *)uStack_4c0;
            name_01._reader.pointers._0_1_ = (char)scope._builder.segment;
            name_01._reader.pointers._1_7_ = scope._builder.segment._1_7_;
            name_01._reader._32_8_ = scope._builder.capTable;
            name_01._reader._40_8_ = scope._builder.data;
            expressionString(name_01);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      ((String *)&scopes,(kj *)0x29cfdb,(char (*) [2])&scope,
                       (String *)"\' is not an annotation.",(char (*) [24])in_R8);
            pSVar12 = (SegmentBuilder *)0x2b02ed;
            if (scopes.builder.capTable != (CapTableBuilder *)0x0) {
              pSVar12 = scopes.builder.segment;
            }
            message_00.content.size_ =
                 (long)&((scopes.builder.capTable)->super_CapTableReader)._vptr_CapTableReader +
                 (ulong)(scopes.builder.capTable == (CapTableBuilder *)0x0);
            message_00.content.ptr = (char *)pSVar12;
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(pEVar1,&name,message_00)
            ;
            kj::Array<char>::~Array((Array<char> *)&scopes);
            kj::Array<char>::~Array((Array<char> *)&scope);
          }
        }
      }
      else {
LAB_00219031:
        pOVar15 = (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)
                  ((ulong)pOVar13 & 0xffffffff);
      }
      pOVar13 = pOVar15;
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue(&decl);
      index = index + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Annotation>> NodeTranslator::compileAnnotationApplications(
    List<Declaration::AnnotationApplication>::Reader annotations,
    kj::StringPtr targetsFlagName) {
  if (annotations.size() == 0 || !compileAnnotations) {
    // Return null.
    return Orphan<List<schema::Annotation>>();
  }

  auto result = orphanage.newOrphan<List<schema::Annotation>>(annotations.size());
  auto builder = result.get();

  for (uint i = 0; i < annotations.size(); i++) {
    Declaration::AnnotationApplication::Reader annotation = annotations[i];
    schema::Annotation::Builder annotationBuilder = builder[i];

    // Set the annotation's value to void in case we fail to produce something better below.
    annotationBuilder.initValue().setVoid();

    auto name = annotation.getName();
    KJ_IF_MAYBE(decl, compileDeclExpression(name, noImplicitParams())) {
      KJ_IF_MAYBE(kind, decl->getKind()) {
        if (*kind != Declaration::ANNOTATION) {
          errorReporter.addErrorOn(name, kj::str(
              "'", expressionString(name), "' is not an annotation."));
        } else {
          annotationBuilder.setId(decl->getIdAndFillBrand(
              [&]() { return annotationBuilder.initBrand(); }));
          KJ_IF_MAYBE(annotationSchema,
                      resolver.resolveBootstrapSchema(annotationBuilder.getId(),
                                                      annotationBuilder.getBrand())) {
            auto node = annotationSchema->getProto().getAnnotation();
            if (!toDynamic(node).get(targetsFlagName).as<bool>()) {
              errorReporter.addErrorOn(name, kj::str(
                  "'", expressionString(name), "' cannot be applied to this kind of declaration."));
            }

            // Interpret the value.
            auto value = annotation.getValue();
            switch (value.which()) {
              case Declaration::AnnotationApplication::Value::NONE:
                // No value, i.e. void.
                if (node.getType().isVoid()) {
                  annotationBuilder.getValue().setVoid();
                } else {
                  errorReporter.addErrorOn(name, kj::str(
                      "'", expressionString(name), "' requires a value."));
                  compileDefaultDefaultValue(node.getType(), annotationBuilder.getValue());
                }
                break;

              case Declaration::AnnotationApplication::Value::EXPRESSION:
                compileBootstrapValue(value.getExpression(), node.getType(),
                                      annotationBuilder.getValue(),
                                      *annotationSchema);
                break;
            }
          }
        }
      } else if (*kind != Declaration::ANNOTATION) {
        errorReporter.addErrorOn(name, kj::str(
            "'", expressionString(name), "' is not an annotation."));
      }
    }
  }

  return result;
}